

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O0

ByteSequence * cobs::cobs_encode(ByteSequence *__return_storage_ptr__,ByteSequence *input)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  bool local_f9;
  long local_f0;
  value_type local_c1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  uchar *local_b8;
  uchar *local_b0;
  uchar *local_a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  const_iterator local_98;
  value_type local_89;
  uchar *local_88;
  uchar *local_80;
  uchar *local_78;
  long local_70;
  difference_type dist;
  uchar local_51;
  uchar *local_50;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  uchar *local_40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator previous_zero_byte;
  const_iterator next_zero_byte;
  ByteSequence *input_local;
  ByteSequence *output;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  previous_zero_byte = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(input);
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(input);
  while( true ) {
    local_38._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(input);
    bVar1 = __gnu_cxx::operator!=(&previous_zero_byte,&local_38);
    if (!bVar1) break;
    local_48._M_current = previous_zero_byte._M_current;
    local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(input);
    local_51 = '\0';
    local_80 = (uchar *)std::
                        find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                                  (local_48,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             )local_50,&local_51);
    local_78 = local_30._M_current;
    local_40 = local_80;
    previous_zero_byte._M_current = local_80;
    local_f0 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         (local_30,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    )local_80);
    if (0xfd < local_f0) {
      local_f0 = 0xfe;
    }
    local_70 = local_f0;
    if (local_f0 == 0xfe) {
      local_88 = (uchar *)__gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+(&local_30,0xfe);
      previous_zero_byte._M_current = local_88;
    }
    local_89 = (char)local_70 + '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_89);
    local_a0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_98,&local_a0);
    local_a8 = local_30._M_current;
    local_b0 = previous_zero_byte._M_current;
    local_b8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   __return_storage_ptr__,local_98,local_30,
                                   previous_zero_byte._M_current);
    local_f9 = false;
    if (local_70 != 0xfe) {
      local_c0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(input);
      local_f9 = __gnu_cxx::operator!=(&previous_zero_byte,&local_c0);
    }
    if (local_f9 != false) {
      std::
      advance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                (&previous_zero_byte,1);
    }
    local_30._M_current = previous_zero_byte._M_current;
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(input);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](input,sVar2 - 1);
  if (*pvVar3 == '\0') {
    local_c1 = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_c1);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteSequence cobs_encode(const ByteSequence &input)
{
  ByteSequence output;
  auto next_zero_byte = input.begin();
  auto previous_zero_byte = input.begin();

  while(next_zero_byte != input.end() )
  {

    next_zero_byte = std::find(next_zero_byte,
                               input.end(),
                               uint8_t(0));

    auto dist = std::distance(previous_zero_byte,next_zero_byte);

	// clip to  max distance
    dist = dist < 254 ? dist: 254;

    if(dist == 254)	next_zero_byte = previous_zero_byte + 254; 

    output.push_back(dist+1);  // add code byte to output

    output.insert(output.end(), previous_zero_byte, next_zero_byte);  //insert block of bytes between to code bytes , e.g two zeros

    if(   dist != 254
          && next_zero_byte != input.end() )
    {
      std:: advance(next_zero_byte,1);//next_zero_byte++;   // if we found a zero we move iterator to prepare for next std::find
    }

    previous_zero_byte = next_zero_byte;
  }

  if(input[input.size()-1] == uint8_t(0)) output.push_back(uint8_t(1)); // last element is zero , add 1 to output


  return(output);
}